

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateP2wshLockingScript
                   (Script *__return_storage_ptr__,Script *redeem_script)

{
  undefined1 local_30 [8];
  ByteData256 script_hash;
  Script *redeem_script_local;
  
  script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)redeem_script;
  HashUtil::Sha256((ByteData256 *)local_30,redeem_script);
  CreateP2wshLockingScript(__return_storage_ptr__,(ByteData256 *)local_30);
  ByteData256::~ByteData256((ByteData256 *)0x4015d4);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2wshLockingScript(const Script& redeem_script) {
  // create script hash
  ByteData256 script_hash = HashUtil::Sha256(redeem_script);

  return CreateP2wshLockingScript(script_hash);
}